

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<3>::minus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((int)*a << 0x12) >> 0x1d;
  iVar2 = ((int)*b << 0x12) >> 0x1d;
  if (iVar2 < 0) {
    return iVar2 + 3 < iVar1;
  }
  if ((uint)((int)*b << 0x12) < 0x20000000) {
    return false;
  }
  return iVar1 < iVar2 + -4;
}

Assistant:

constexpr int ampere() const { return ampere_; }